

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

bool __thiscall MT32Emu::Synth::loadPCMROM(Synth *this,ROMImage *pcmROMImage)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  File *pFVar4;
  ROMInfo *pRVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte *pbVar6;
  uint local_a4;
  int local_a0;
  int bit;
  int u;
  Bit16s log;
  int order [16];
  Bit8u c;
  ulong uStack_48;
  Bit8u s;
  size_t i;
  Bit8u *fileData;
  size_t fileSize;
  ROMInfo *pcmROMInfo;
  File *file;
  ROMImage *pcmROMImage_local;
  Synth *this_local;
  
  pFVar4 = ROMImage::getFile(pcmROMImage);
  pRVar5 = ROMImage::getROMInfo(pcmROMImage);
  if (((pRVar5 == (ROMInfo *)0x0) || (pRVar5->type != PCM)) || (pRVar5->pairType != Full)) {
    this_local._7_1_ = false;
  }
  else {
    iVar3 = (*pFVar4->_vptr_File[2])();
    if (CONCAT44(extraout_var,iVar3) == this->pcmROMSize * 2) {
      iVar3 = (*pFVar4->_vptr_File[3])();
      i = CONCAT44(extraout_var_00,iVar3);
      for (uStack_48 = 0; uStack_48 < this->pcmROMSize; uStack_48 = uStack_48 + 1) {
        pbVar6 = (byte *)(i + 1);
        bVar1 = *(byte *)i;
        i = i + 2;
        bVar2 = *pbVar6;
        memcpy(&u,&DAT_001d8750,0x40);
        bit._2_2_ = 0;
        for (local_a0 = 0; local_a0 < 0x10; local_a0 = local_a0 + 1) {
          if ((&u)[local_a0] < 8) {
            local_a4 = (int)(uint)bVar1 >> (7U - (char)(&u)[local_a0] & 0x1f);
          }
          else {
            local_a4 = (int)(uint)bVar2 >> (7U - ((char)(&u)[local_a0] + -8) & 0x1f);
          }
          local_a4 = local_a4 & 1;
          bit._2_2_ = bit._2_2_ | (ushort)(local_a4 << (0xfU - (char)local_a0 & 0x1f));
        }
        this->pcmROMData[uStack_48] = bit._2_2_;
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Synth::loadPCMROM(const ROMImage &pcmROMImage) {
	File *file = pcmROMImage.getFile();
	const ROMInfo *pcmROMInfo = pcmROMImage.getROMInfo();
	if ((pcmROMInfo == NULL)
			|| (pcmROMInfo->type != ROMInfo::PCM)
			|| (pcmROMInfo->pairType != ROMInfo::Full)) {
		return false;
	}
#if MT32EMU_MONITOR_INIT
	printDebug("Found PCM ROM: %s, %s", pcmROMInfo->shortName, pcmROMInfo->description);
#endif
	size_t fileSize = file->getSize();
	if (fileSize != (2 * pcmROMSize)) {
#if MT32EMU_MONITOR_INIT
		printDebug("PCM ROM file has wrong size (expected %d, got %d)", 2 * pcmROMSize, fileSize);
#endif
		return false;
	}
	const Bit8u *fileData = file->getData();
	for (size_t i = 0; i < pcmROMSize; i++) {
		Bit8u s = *(fileData++);
		Bit8u c = *(fileData++);

		int order[16] = {0, 9, 1, 2, 3, 4, 5, 6, 7, 10, 11, 12, 13, 14, 15, 8};

		Bit16s log = 0;
		for (int u = 0; u < 16; u++) {
			int bit;
			if (order[u] < 8) {
				bit = (s >> (7 - order[u])) & 0x1;
			} else {
				bit = (c >> (7 - (order[u] - 8))) & 0x1;
			}
			log = log | Bit16s(bit << (15 - u));
		}
		pcmROMData[i] = log;
	}
	return true;
}